

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> * __thiscall
testing::internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::
operator=(MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,
         MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *other)

{
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *in_RSI;
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *in_RDI;
  MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    Destroy(in_RDI);
    in_RDI->vtable_ = in_RSI->vtable_;
    in_RDI->buffer_ = in_RSI->buffer_;
    in_RSI->vtable_ = (VTable *)0x0;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }